

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_api_v2.c
# Opt level: O1

MPP_RET hal_h264e_init(void *hal,MppEncHalCfg *cfg)

{
  bool bVar1;
  bool bVar2;
  RK_U32 RVar3;
  MPP_RET MVar4;
  void *pvVar5;
  MppEncHalApi *pMVar6;
  
  RVar3 = mpp_get_vcodec_type();
  mpp_env_get_u32("hal_h264e_debug",&hal_h264e_debug,0);
  if ((RVar3 >> 0x10 & 1) == 0) {
    if ((RVar3 >> 0x12 & 1) == 0) {
      if ((RVar3 >> 0x11 & 1) == 0) {
        bVar2 = false;
        _mpp_log_l(2,"hal_h264e_api_v2","vcodec type %08x can not find H.264 encoder device\n",
                   (char *)0x0,(ulong)RVar3);
        bVar1 = true;
        pMVar6 = (MppEncHalApi *)0x0;
        goto LAB_0021def7;
      }
      pMVar6 = &hal_h264e_vepu1;
    }
    else {
      pMVar6 = &hal_h264e_vepu2;
    }
  }
  else {
    RVar3 = mpp_get_client_hw_id(0x10);
    if ((int)RVar3 < 0x50603313) {
      if (RVar3 == 0x50602715) {
        pMVar6 = &hal_h264e_vepu511;
      }
      else if (RVar3 == 0x50603312) {
        pMVar6 = &hal_h264e_vepu580;
      }
      else {
LAB_0021dedc:
        pMVar6 = &hal_h264e_vepu541;
      }
    }
    else if (RVar3 == 0x506f2314) {
      pMVar6 = &hal_h264e_vepu510;
    }
    else {
      if (RVar3 != 0x50603313) goto LAB_0021dedc;
      pMVar6 = &hal_h264e_vepu540c;
    }
  }
  bVar2 = true;
  bVar1 = false;
LAB_0021def7:
  if (bVar1) {
    _mpp_log_l(2,"hal_h264e_api_v2","Assertion %s failed at %s:%d\n",(char *)0x0,"api",
               "hal_h264e_init",0x56);
    if ((mpp_debug._3_1_ & 0x10) != 0) {
      abort();
    }
  }
  if (bVar2) {
    pvVar5 = mpp_osal_calloc("hal_h264e_init",(ulong)pMVar6->ctx_size);
  }
  else {
    pvVar5 = (void *)0x0;
  }
  *(MppEncHalApi **)hal = pMVar6;
  *(void **)((long)hal + 8) = pvVar5;
  if (bVar2) {
    MVar4 = (*pMVar6->init)(pvVar5,cfg);
    return MVar4;
  }
  return MPP_NOK;
}

Assistant:

static MPP_RET hal_h264e_init(void *hal, MppEncHalCfg *cfg)
{
    HalH264eCtx *ctx = (HalH264eCtx *)hal;
    const MppEncHalApi *api = NULL;
    void *hw_ctx = NULL;
    MPP_RET ret = MPP_OK;
    RK_U32 vcodec_type = mpp_get_vcodec_type();

    mpp_env_get_u32("hal_h264e_debug", &hal_h264e_debug, 0);

    if (vcodec_type & HAVE_RKVENC) {
        RK_U32 hw_id = mpp_get_client_hw_id(VPU_CLIENT_RKVENC);

        switch (hw_id) {
        case HWID_VEPU58X : {
            api = &hal_h264e_vepu580;
        } break;
        case HWID_VEPU540C : {
            api = &hal_h264e_vepu540c;
        } break;
        case HWID_VEPU510 : {
            api = &hal_h264e_vepu510;
        } break;
        case HWID_VEPU511 : {
            api = &hal_h264e_vepu511;
        } break;
        default : {
            api = &hal_h264e_vepu541;
        } break;
        }
    } else if (vcodec_type & HAVE_VEPU2) {
        api = &hal_h264e_vepu2;
    } else if (vcodec_type & HAVE_VEPU1) {
        api = &hal_h264e_vepu1;
    } else {
        mpp_err("vcodec type %08x can not find H.264 encoder device\n",
                vcodec_type);
        ret = MPP_NOK;
    }

    mpp_assert(api);

    if (!ret)
        hw_ctx = mpp_calloc_size(void, api->ctx_size);

    ctx->api = api;
    ctx->hw_ctx = hw_ctx;

    if (ret)
        return ret;

    ret = api->init(hw_ctx, cfg);
    return ret;
}